

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Eval
          (IsGreaterThanZero *this,SENode *node,bool or_equal_zero,bool *result)

{
  Signedness SVar1;
  bool *result_local;
  bool or_equal_zero_local;
  SENode *node_local;
  IsGreaterThanZero *this_local;
  
  *result = false;
  SVar1 = Visit(this,node);
  switch(SVar1) {
  case kPositiveOrNegative:
    return false;
  case kStrictlyNegative:
    *result = false;
    break;
  case kNegative:
    if (!or_equal_zero) {
      return false;
    }
    *result = false;
    break;
  case kStrictlyPositive:
    *result = true;
    break;
  case kPositive:
    if (!or_equal_zero) {
      return false;
    }
    *result = true;
  }
  return true;
}

Assistant:

bool Eval(const SENode* node, bool or_equal_zero, bool* result) {
    *result = false;
    switch (Visit(node)) {
      case Signedness::kPositiveOrNegative: {
        return false;
      }
      case Signedness::kStrictlyNegative: {
        *result = false;
        break;
      }
      case Signedness::kNegative: {
        if (!or_equal_zero) {
          return false;
        }
        *result = false;
        break;
      }
      case Signedness::kStrictlyPositive: {
        *result = true;
        break;
      }
      case Signedness::kPositive: {
        if (!or_equal_zero) {
          return false;
        }
        *result = true;
        break;
      }
    }
    return true;
  }